

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O2

void __thiscall Potassco::AspifOutput::acycEdge(AspifOutput *this,int s,int t,LitSpan *cond)

{
  startDir(this,(Directive_t)0x8);
  add(this,s);
  add(this,t);
  add(this,cond);
  endDir(this);
  return;
}

Assistant:

void AspifOutput::acycEdge(int s, int t, const LitSpan& cond) {
	startDir(Directive_t::Edge).add(s).add(t).add(cond).endDir();
}